

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxBuffer.cpp
# Opt level: O1

void __thiscall Jinx::Buffer::Read(Buffer *this,size_t *pos,BufferPtr *buffer,size_t bytes)

{
  element_type *peVar1;
  uint8_t *puVar2;
  
  if (this->m_size - *pos < bytes) {
    __assert_fail("bytes <= (m_size - *pos)",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                  ,0x2c,"void Jinx::Buffer::Read(size_t *, BufferPtr &, size_t)");
  }
  if (bytes != 0) {
    peVar1 = (buffer->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1->m_capacity < bytes) {
      puVar2 = (uint8_t *)MemReallocate(peVar1->m_data,bytes,peVar1->m_capacity);
      peVar1->m_data = puVar2;
      peVar1->m_capacity = bytes;
    }
    memcpy(((buffer->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_data,
           this->m_data + *pos,bytes);
    *pos = *pos + bytes;
    ((buffer->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_size = bytes;
    return;
  }
  __assert_fail("bytesToCopy",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                ,0x2e,"void Jinx::Buffer::Read(size_t *, BufferPtr &, size_t)");
}

Assistant:

inline_t void Buffer::Read(size_t * pos, BufferPtr & buffer, size_t bytes)
	{
		assert(bytes <= (m_size - *pos));
		size_t bytesToCopy = std::min(bytes, m_size - *pos);
		assert(bytesToCopy);
		assert(bytesToCopy == bytes);
		buffer->Reserve(bytesToCopy);
		memcpy(buffer->m_data, m_data + *pos, bytesToCopy);
		*pos += bytes;
		buffer->m_size = bytesToCopy;
	}